

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_AsmCall<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  byte bVar1;
  long lVar2;
  InterpreterStackFrame *pIVar3;
  code *pcVar4;
  bool bVar5;
  ushort uVar6;
  RegSlot RVar7;
  RegSlot RVar8;
  RecyclableObject *function;
  JavascriptMethod p_Var9;
  Var pvVar10;
  undefined4 *puVar11;
  undefined8 *puVar12;
  Arguments local_60;
  Arguments local_50;
  Type local_40;
  undefined1 local_31;
  
  function = JavascriptOperators::GetCallableObjectOrThrow
                       (*(Var *)(*(long *)(this + 0x120) + (ulong)playout->Function * 8),
                        *(ScriptContext **)(this + 0x78));
  bVar1 = *(byte *)(*(long *)(*(long *)(this + 0x88) + 0x20) + 0xa8);
  if ((byte)((bVar1 & 0x40) >> 6 &
            (bVar1 >> 5 | *(long *)(*(long *)(*(long *)(this + 0x88) + 0x20) + 0x80) != 0)) == 1) {
    JavascriptFunction::CheckValidDebugThunk(*(ScriptContext **)(this + 0x78),function);
  }
  lVar2 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  local_31 = *(undefined1 *)(lVar2 + 0x10a);
  *(undefined1 *)(lVar2 + 0x10a) = 1;
  uVar6 = playout->ArgCount;
  local_40 = *(Type *)(this + 0x28);
  if (playout->Return == 0xffffffff) {
    p_Var9 = RecyclableObject::GetEntryPoint(function);
    local_60.Info = (Type)((ulong)uVar6 | 0x10000000);
    local_60.Values = local_40;
    JavascriptFunction::CallFunction<true>(function,p_Var9,&local_60,false);
  }
  else {
    p_Var9 = RecyclableObject::GetEntryPoint(function);
    local_50.Info = (Type)((ulong)uVar6 | 0x2000000);
    local_50.Values = local_40;
    pvVar10 = JavascriptFunction::CallFunction<true>(function,p_Var9,&local_50,false);
    *(Var *)(*(long *)(this + 0x120) + (ulong)playout->Return * 8) = pvVar10;
  }
  *(undefined1 *)(lVar2 + 0x10a) = local_31;
  uVar6 = playout->ArgCount + 1;
  if (uVar6 == 0) {
    ::Math::DefaultOverflowPolicy();
  }
  puVar12 = (undefined8 *)(*(long *)(this + 0x30) + (ulong)uVar6 * -8);
  *(undefined8 **)(this + 0x30) = puVar12;
  *(undefined8 *)(this + 0x28) = *puVar12;
  RVar7 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
  pIVar3 = *(InterpreterStackFrame **)(this + 0x30);
  if (this + (ulong)RVar7 * 8 + 0x160 <= pIVar3) {
    RVar7 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
    RVar8 = FunctionBody::GetOutParamMaxDepth(*(FunctionBody **)(this + 0x88));
    if (pIVar3 < this + (ulong)RVar8 * 8 + (ulong)RVar7 * 8 + 0x160) {
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar11 = 1;
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x9ac,
                              "(m_localSlots + this->m_functionBody->GetLocalsCount() <= m_outSp && m_outSp < (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()))"
                              ,"out args Stack pointer not in range after Pop");
  if (bVar5) {
    *puVar11 = 0;
    return;
  }
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

void InterpreterStackFrame::OP_AsmCall(const unaligned T* playout)
    {
        Var target = GetRegRawPtr(playout->Function);

        RecyclableObject * function = OP_CallGetFunc(target);

#if DBG
        if (this->IsInDebugMode())
        {
            JavascriptFunction::CheckValidDebugThunk(scriptContext, function);
        }
#endif

        BEGIN_SAFE_REENTRANT_REGION(this->scriptContext->GetThreadContext())
        {
            if (playout->Return == Js::Constants::NoRegister)

            {
                Arguments args(CallInfo(CallFlags_NotUsed, playout->ArgCount), m_outParams);
                JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args);
            }
            else
            {
                Arguments args(CallInfo(CallFlags_Value, playout->ArgCount), m_outParams);
                Var retVal = JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args);
                SetRegRawPtr(playout->Return, retVal);
            }
        }
        END_SAFE_REENTRANT_REGION

            PopOut(playout->ArgCount);
    }